

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O3

void UpdateModel(CPpmd8 *p)

{
  uint *puVar1;
  byte bVar2;
  byte bVar3;
  Byte BVar4;
  byte bVar5;
  byte bVar6;
  UInt16 UVar7;
  ushort uVar8;
  CPpmd8_Context *pCVar9;
  UInt16 UVar10;
  Byte BVar11;
  Byte BVar12;
  UInt16 UVar13;
  uint uVar14;
  CTX_PTR pCVar15;
  CTX_PTR pCVar16;
  void *pvVar17;
  undefined4 *puVar18;
  Byte *pBVar19;
  byte bVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  short sVar24;
  Byte *pBVar25;
  short sVar26;
  CPpmd_State *pCVar27;
  CPpmd_State *pCVar28;
  uint uVar29;
  CPpmd8_Context *c1;
  uint uVar31;
  CPpmd_State tmp;
  long lVar30;
  
  pCVar28 = p->FoundState;
  uVar31._0_2_ = pCVar28->SuccessorLow;
  uVar31._2_2_ = pCVar28->SuccessorHigh;
  bVar2 = pCVar28->Freq;
  bVar3 = pCVar28->Symbol;
  if ((bVar2 < 0x1f) && (uVar23 = (ulong)p->MinContext->Suffix, uVar23 != 0)) {
    pBVar19 = p->Base;
    if (pBVar19[uVar23] == '\0') {
      pCVar28 = (CPpmd_State *)(pBVar19 + uVar23 + 2);
      if (pBVar19[uVar23 + 3] < 0x20) {
        pBVar19[uVar23 + 3] = pBVar19[uVar23 + 3] + 1;
      }
    }
    else {
      pCVar28 = (CPpmd_State *)(pBVar19 + *(uint *)(pBVar19 + uVar23 + 4));
      if (pBVar19[*(uint *)(pBVar19 + uVar23 + 4)] != bVar3) {
        do {
          pCVar27 = pCVar28;
          pCVar28 = pCVar27 + 1;
        } while (pCVar27[1].Symbol != bVar3);
        if (pCVar27->Freq <= pCVar27[1].Freq) {
          UVar7 = pCVar27[1].SuccessorHigh;
          BVar11 = pCVar28->Symbol;
          BVar12 = pCVar28->Freq;
          UVar13 = pCVar28->SuccessorLow;
          pCVar27[1].SuccessorHigh = pCVar27->SuccessorHigh;
          BVar4 = pCVar27->Freq;
          UVar10 = pCVar27->SuccessorLow;
          pCVar28->Symbol = pCVar27->Symbol;
          pCVar28->Freq = BVar4;
          pCVar28->SuccessorLow = UVar10;
          pCVar27->SuccessorHigh = UVar7;
          pCVar27->Symbol = BVar11;
          pCVar27->Freq = BVar12;
          pCVar27->SuccessorLow = UVar13;
          pCVar28 = pCVar27;
        }
      }
      if (pCVar28->Freq < 0x73) {
        pCVar28->Freq = pCVar28->Freq + 2;
        *(short *)(pBVar19 + uVar23 + 2) = *(short *)(pBVar19 + uVar23 + 2) + 2;
      }
    }
  }
  else {
    pCVar28 = (CPpmd_State *)0x0;
  }
  c1 = p->MaxContext;
  if ((p->OrderFall == 0) && (uVar31 != 0)) {
    pCVar15 = CreateSuccessors(p,1,pCVar28,p->MinContext);
    pCVar28 = p->FoundState;
    if (pCVar15 == (CTX_PTR)0x0) {
      pCVar28->SuccessorLow = 0;
      pCVar28->SuccessorHigh = 0;
LAB_001711bd:
      RestoreModel(p,c1);
      return;
    }
    *(int *)&pCVar28->SuccessorLow = (int)pCVar15 - *(int *)&p->Base;
    p->MaxContext = pCVar15;
  }
  else {
    pBVar19 = p->Text;
    BVar4 = p->FoundState->Symbol;
    p->Text = pBVar19 + 1;
    *pBVar19 = BVar4;
    if (p->UnitsStart <= p->Text) goto LAB_001711bd;
    pBVar19 = p->Base;
    lVar30 = (long)p->Text - (long)pBVar19;
    uVar29 = (uint)lVar30;
    if (uVar31 == 0) {
      pCVar15 = p->MinContext;
      pCVar27 = p->FoundState;
      pCVar27->SuccessorLow = (short)uVar29;
      pCVar27->SuccessorHigh = (short)(uVar29 >> 0x10);
      uVar31 = p->OrderFall;
      pCVar16 = pCVar15;
      while( true ) {
        uVar31 = uVar31 + 1;
        uVar23 = (ulong)pCVar16->Suffix;
        if (pCVar28 == (CPpmd_State *)0x0) {
          if (uVar23 == 0) {
            p->OrderFall = uVar31;
            uVar31 = (int)pCVar16 - (int)pBVar19;
            goto LAB_0017135e;
          }
          if (pBVar19[uVar23] == '\0') {
            pCVar28 = (CPpmd_State *)(pBVar19 + uVar23 + 2);
            pBVar19[uVar23 + 3] = pBVar19[uVar23 + 3] + (pBVar19[uVar23 + 3] < 0x20);
          }
          else {
            BVar4 = pBVar19[*(uint *)(pBVar19 + uVar23 + 4)];
            pCVar28 = (CPpmd_State *)(pBVar19 + *(uint *)(pBVar19 + uVar23 + 4));
            while (BVar4 != pCVar27->Symbol) {
              BVar4 = pCVar28[1].Symbol;
              pCVar28 = pCVar28 + 1;
            }
            if (pCVar28->Freq < 0x73) {
              pCVar28->Freq = pCVar28->Freq + 2;
              *(short *)(pBVar19 + uVar23 + 2) = *(short *)(pBVar19 + uVar23 + 2) + 2;
            }
          }
        }
        pCVar16 = (CTX_PTR)(pBVar19 + uVar23);
        uVar21 = (uint)pCVar28->SuccessorLow;
        uVar14._0_2_ = pCVar28->SuccessorLow;
        uVar14._2_2_ = pCVar28->SuccessorHigh;
        uVar22 = (uint)pCVar28->SuccessorHigh;
        if (uVar14 != 0) break;
        pCVar28->SuccessorLow = (UInt16)lVar30;
        pCVar28->SuccessorHigh = (UInt16)((ulong)lVar30 >> 0x10);
        pCVar28 = (CPpmd_State *)0x0;
      }
      p->OrderFall = uVar31;
      if (uVar14 <= uVar29) {
        p->FoundState = pCVar28;
        uVar21 = 0;
        pCVar16 = CreateSuccessors(p,0,(CPpmd_State *)0x0,pCVar16);
        if (pCVar16 == (CTX_PTR)0x0) {
          uVar22 = 0;
        }
        else {
          uVar21 = (int)pCVar16 - (int)p->Base;
          uVar22 = uVar21 >> 0x10;
        }
        pCVar28->SuccessorLow = (UInt16)uVar21;
        pCVar28->SuccessorHigh = (UInt16)uVar22;
        p->FoundState = pCVar27;
        uVar31 = p->OrderFall;
      }
      if ((uVar31 == 1) && (p->MaxContext == pCVar15)) {
        pCVar27->SuccessorLow = (UInt16)uVar21;
        pCVar27->SuccessorHigh = (UInt16)uVar22;
        p->Text = p->Text + -1;
        uVar21 = (uint)pCVar28->SuccessorLow;
        uVar22 = (uint)pCVar28->SuccessorHigh;
      }
      uVar31 = uVar22 << 0x10 | uVar21 & 0xffff;
      if (uVar31 == 0) goto LAB_001711bd;
    }
    else if (pBVar19 + uVar31 < p->UnitsStart) {
      pCVar15 = CreateSuccessors(p,0,pCVar28,p->MinContext);
      if (pCVar15 == (CTX_PTR)0x0) goto LAB_001711bd;
      uVar31 = (int)pCVar15 - *(int *)&p->Base;
    }
LAB_0017135e:
    puVar1 = &p->OrderFall;
    *puVar1 = *puVar1 - 1;
    pCVar9 = p->MinContext;
    if (*puVar1 == 0) {
      p->Text = p->Text + -(ulong)(p->MaxContext != pCVar9);
      uVar29 = uVar31;
    }
    if (c1 == pCVar9) {
      pBVar19 = p->Base;
    }
    else {
      bVar5 = pCVar9->NumStats;
      uVar8 = pCVar9->SummFreq;
      do {
        bVar6 = c1->NumStats;
        uVar23 = (ulong)bVar6;
        if (bVar6 == 0) {
          puVar18 = (undefined4 *)AllocUnits(p,0);
          if (puVar18 == (undefined4 *)0x0) goto LAB_001711bd;
          *(undefined2 *)(puVar18 + 1) = *(undefined2 *)((long)&c1->Stats + 2);
          *puVar18 = *(undefined4 *)&c1->SummFreq;
          c1->Stats = (int)puVar18 - *(int *)&p->Base;
          bVar20 = *(byte *)((long)puVar18 + 1) * '\x02';
          if (0x1d < *(byte *)((long)puVar18 + 1)) {
            bVar20 = 0x78;
          }
          *(byte *)((long)puVar18 + 1) = bVar20;
          uVar14 = p->InitEsc + (uint)(2 < bVar5) + (uint)bVar20;
        }
        else {
          if ((bVar6 & 1) != 0) {
            uVar14 = bVar6 + 1 >> 1;
            bVar20 = p->Units2Indx[uVar14 - 1];
            if (bVar20 != p->Units2Indx[uVar14]) {
              pvVar17 = AllocUnits(p,bVar20 + 1);
              if (pvVar17 == (void *)0x0) goto LAB_001711bd;
              pBVar19 = p->Base;
              uVar14 = c1->Stats;
              pBVar25 = pBVar19 + uVar14;
              lVar30 = 0;
              do {
                *(undefined4 *)((long)pvVar17 + lVar30) = *(undefined4 *)(pBVar25 + lVar30);
                *(undefined4 *)((long)pvVar17 + lVar30 + 4) = *(undefined4 *)(pBVar25 + lVar30 + 4);
                *(undefined4 *)((long)pvVar17 + lVar30 + 8) = *(undefined4 *)(pBVar25 + lVar30 + 8);
                lVar30 = lVar30 + 0xc;
              } while (((uint)bVar6 * 2 + 2 & 0xfffffffc) * 3 != (int)lVar30);
              pBVar25[0] = 0xff;
              pBVar25[1] = 0xff;
              pBVar25[2] = 0xff;
              pBVar25[3] = 0xff;
              *(CPpmd_Void_Ref *)(pBVar25 + 4) = p->FreeList[bVar20];
              *(uint *)(pBVar25 + 8) = (uint)p->Indx2Units[bVar20];
              p->FreeList[bVar20] = uVar14;
              p->Stamps[bVar20] = p->Stamps[bVar20] + 1;
              c1->Stats = (int)pvVar17 - (int)pBVar19;
            }
          }
          uVar14 = (uint)(ushort)(c1->SummFreq + (ushort)((uint)bVar6 * 3 + 1 < (uint)bVar5));
        }
        uVar21 = ((uVar14 & 0xffff) + 6) * (uint)bVar2 * 2;
        uVar22 = (uVar14 & 0xffff) + ((uint)uVar8 - ((uint)bVar2 + (uint)bVar5));
        if (uVar21 < uVar22 * 6) {
          sVar26 = 4;
          sVar24 = ((ushort)(uVar22 < uVar21) - (ushort)(uVar21 < uVar22 * 4)) + 2;
        }
        else {
          sVar26 = (ushort)(uVar22 * 0xc < uVar21) + (ushort)(uVar22 * 9 < uVar21) +
                   (ushort)(uVar22 * 0xf < uVar21) + 4;
          sVar24 = sVar26;
        }
        c1->SummFreq = sVar26 + (short)uVar14;
        pBVar19 = p->Base;
        uVar14 = c1->Stats;
        *(short *)(pBVar19 + uVar23 * 6 + (ulong)uVar14 + 8) = (short)uVar29;
        *(short *)(pBVar19 + uVar23 * 6 + (ulong)uVar14 + 10) = (short)(uVar29 >> 0x10);
        pBVar19[uVar23 * 6 + (ulong)uVar14 + 6] = bVar3;
        pBVar19[uVar23 * 6 + (ulong)uVar14 + 7] = (Byte)sVar24;
        c1->Flags = c1->Flags | (0x3f < bVar3) << 3;
        c1->NumStats = bVar6 + 1;
        c1 = (CPpmd8_Context *)(pBVar19 + c1->Suffix);
      } while (c1 != p->MinContext);
    }
    p->MinContext = (CPpmd8_Context *)(pBVar19 + uVar31);
    p->MaxContext = (CPpmd8_Context *)(pBVar19 + uVar31);
  }
  return;
}

Assistant:

static void UpdateModel(CPpmd8 *p)
{
  CPpmd_Void_Ref successor, fSuccessor = SUCCESSOR(p->FoundState);
  CTX_PTR c;
  unsigned s0, ns, fFreq = p->FoundState->Freq;
  Byte flag, fSymbol = p->FoundState->Symbol;
  CPpmd_State *s = NULL;
  
  if (p->FoundState->Freq < MAX_FREQ / 4 && p->MinContext->Suffix != 0)
  {
    c = SUFFIX(p->MinContext);
    
    if (c->NumStats == 0)
    {
      s = ONE_STATE(c);
      if (s->Freq < 32)
        s->Freq++;
    }
    else
    {
      s = STATS(c);
      if (s->Symbol != p->FoundState->Symbol)
      {
        do { s++; } while (s->Symbol != p->FoundState->Symbol);
        if (s[0].Freq >= s[-1].Freq)
        {
          SwapStates(&s[0], &s[-1]);
          s--;
        }
      }
      if (s->Freq < MAX_FREQ - 9)
      {
        s->Freq += 2;
        c->SummFreq += 2;
      }
    }
  }
  
  c = p->MaxContext;
  if (p->OrderFall == 0 && fSuccessor)
  {
    CTX_PTR cs = CreateSuccessors(p, True, s, p->MinContext);
    if (cs == 0)
    {
      SetSuccessor(p->FoundState, 0);
      RESTORE_MODEL(c, CTX(fSuccessor));
    }
    else
    {
      SetSuccessor(p->FoundState, REF(cs));
      p->MaxContext = cs;
    }
    return;
  }
  
  *p->Text++ = p->FoundState->Symbol;
  successor = REF(p->Text);
  if (p->Text >= p->UnitsStart)
  {
    RESTORE_MODEL(c, CTX(fSuccessor)); /* check it */
    return;
  }
  
  if (!fSuccessor)
  {
    CTX_PTR cs = ReduceOrder(p, s, p->MinContext);
    if (cs == NULL)
    {
      RESTORE_MODEL(c, 0);
      return;
    }
    fSuccessor = REF(cs);
  }
  else if ((Byte *)Ppmd8_GetPtr(p, fSuccessor) < p->UnitsStart)
  {
    CTX_PTR cs = CreateSuccessors(p, False, s, p->MinContext);
    if (cs == NULL)
    {
      RESTORE_MODEL(c, 0);
      return;
    }
    fSuccessor = REF(cs);
  }
  
  if (--p->OrderFall == 0)
  {
    successor = fSuccessor;
    p->Text -= (p->MaxContext != p->MinContext);
  }
  #ifdef PPMD8_FREEZE_SUPPORT
  else if (p->RestoreMethod > PPMD8_RESTORE_METHOD_FREEZE)
  {
    successor = fSuccessor;
    RESET_TEXT(0);
    p->OrderFall = 0;
  }
  #endif
  
  s0 = p->MinContext->SummFreq - (ns = p->MinContext->NumStats) - fFreq;
  flag = (Byte)(0x08 * (fSymbol >= 0x40));
  
  for (; c != p->MinContext; c = SUFFIX(c))
  {
    unsigned ns1;
    UInt32 cf, sf;
    if ((ns1 = c->NumStats) != 0)
    {
      if ((ns1 & 1) != 0)
      {
        /* Expand for one UNIT */
        unsigned oldNU = (ns1 + 1) >> 1;
        unsigned i = U2I(oldNU);
        if (i != U2I(oldNU + 1))
        {
          void *ptr = AllocUnits(p, i + 1);
          void *oldPtr;
          if (!ptr)
          {
            RESTORE_MODEL(c, CTX(fSuccessor));
            return;
          }
          oldPtr = STATS(c);
          MyMem12Cpy(ptr, oldPtr, oldNU);
          InsertNode(p, oldPtr, i);
          c->Stats = STATS_REF(ptr);
        }
      }
      c->SummFreq = (UInt16)(c->SummFreq + (3 * ns1 + 1 < ns));
    }
    else
    {
      CPpmd_State *s2 = (CPpmd_State*)AllocUnits(p, 0);
      if (!s2)
      {
        RESTORE_MODEL(c, CTX(fSuccessor));
        return;
      }
      *s2 = *ONE_STATE(c);
      c->Stats = REF(s2);
      if (s2->Freq < MAX_FREQ / 4 - 1)
        s2->Freq <<= 1;
      else
        s2->Freq = MAX_FREQ - 4;
      c->SummFreq = (UInt16)(s2->Freq + p->InitEsc + (ns > 2));
    }
    cf = 2 * fFreq * (c->SummFreq + 6);
    sf = (UInt32)s0 + c->SummFreq;
    if (cf < 6 * sf)
    {
      cf = 1 + (cf > sf) + (cf >= 4 * sf);
      c->SummFreq += 4;
    }
    else
    {
      cf = 4 + (cf > 9 * sf) + (cf > 12 * sf) + (cf > 15 * sf);
      c->SummFreq = (UInt16)(c->SummFreq + cf);
    }
    {
      CPpmd_State *s2 = STATS(c) + ns1 + 1;
      SetSuccessor(s2, successor);
      s2->Symbol = fSymbol;
      s2->Freq = (Byte)cf;
      c->Flags |= flag;
      c->NumStats = (Byte)(ns1 + 1);
    }
  }
  p->MaxContext = p->MinContext = CTX(fSuccessor);
}